

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# toplevel_unit.c
# Opt level: O3

void test_inplace_negation_helper(_Bool runopt,uint32_t gap)

{
  _Bool _Var1;
  roaring_bitmap_t *prVar2;
  uint64_t uVar3;
  roaring_bitmap_t *r;
  uint64_t b;
  long lVar4;
  uint32_t val;
  ulong uVar5;
  
  uVar5 = 0;
  prVar2 = roaring_bitmap_create_with_capacity(0);
  _assert_true((unsigned_long)prVar2,"r1",
               "/workspace/llm4binary/github/license_c_cmakelists/RoaringBitmap[P]CRoaring/tests/toplevel_unit.c"
               ,0xcdb);
  do {
    val = (uint32_t)uVar5;
    if (gap <= (int)(uVar5 / 0x93) * -0x93 + val) {
      roaring_bitmap_add(prVar2,val);
      roaring_bitmap_add(prVar2,val + 0x50000);
    }
    uVar5 = (ulong)(val + 1);
  } while (val + 1 != 0x10000);
  if (runopt) {
    _Var1 = roaring_bitmap_run_optimize(prVar2);
    _assert_true((ulong)_Var1,"hasrun",
                 "/workspace/llm4binary/github/license_c_cmakelists/RoaringBitmap[P]CRoaring/tests/toplevel_unit.c"
                 ,0xce4);
  }
  uVar3 = roaring_bitmap_get_cardinality(prVar2);
  r = roaring_bitmap_copy(prVar2);
  roaring_bitmap_flip_inplace(prVar2,0,100000);
  _assert_true((unsigned_long)prVar2,"r1",
               "/workspace/llm4binary/github/license_c_cmakelists/RoaringBitmap[P]CRoaring/tests/toplevel_unit.c"
               ,0xcec);
  b = roaring_bitmap_get_cardinality(prVar2);
  _assert_int_equal(100000,b,
                    "/workspace/llm4binary/github/license_c_cmakelists/RoaringBitmap[P]CRoaring/tests/toplevel_unit.c"
                    ,0xcef);
  roaring_bitmap_free(prVar2);
  prVar2 = roaring_bitmap_copy(r);
  roaring_bitmap_flip_inplace(prVar2,0,1000000);
  _assert_true((unsigned_long)prVar2,"r1",
               "/workspace/llm4binary/github/license_c_cmakelists/RoaringBitmap[P]CRoaring/tests/toplevel_unit.c"
               ,0xcf5);
  lVar4 = uVar3 << 0x20;
  uVar3 = roaring_bitmap_get_cardinality(prVar2);
  _assert_int_equal(0xf424000000000 - lVar4 >> 0x20,uVar3,
                    "/workspace/llm4binary/github/license_c_cmakelists/RoaringBitmap[P]CRoaring/tests/toplevel_unit.c"
                    ,0xcf6);
  roaring_bitmap_free(prVar2);
  prVar2 = roaring_bitmap_copy(r);
  roaring_bitmap_flip_inplace(prVar2,100000,200000);
  _assert_true((unsigned_long)prVar2,"r1",
               "/workspace/llm4binary/github/license_c_cmakelists/RoaringBitmap[P]CRoaring/tests/toplevel_unit.c"
               ,0xcfc);
  uVar3 = roaring_bitmap_get_cardinality(prVar2);
  _assert_int_equal(lVar4 + 0x186a000000000 >> 0x20,uVar3,
                    "/workspace/llm4binary/github/license_c_cmakelists/RoaringBitmap[P]CRoaring/tests/toplevel_unit.c"
                    ,0xcfd);
  roaring_bitmap_free(prVar2);
  prVar2 = roaring_bitmap_copy(r);
  roaring_bitmap_flip_inplace(prVar2,1,0x60000);
  _assert_true((unsigned_long)prVar2,"r1",
               "/workspace/llm4binary/github/license_c_cmakelists/RoaringBitmap[P]CRoaring/tests/toplevel_unit.c"
               ,0xd03);
  uVar3 = roaring_bitmap_get_cardinality(prVar2);
  _assert_int_equal(0x5ffff00000000 - lVar4 >> 0x20,uVar3,
                    "/workspace/llm4binary/github/license_c_cmakelists/RoaringBitmap[P]CRoaring/tests/toplevel_unit.c"
                    ,0xd05);
  roaring_bitmap_free(prVar2);
  prVar2 = roaring_bitmap_copy(r);
  roaring_bitmap_flip_inplace(prVar2,1,0x50000);
  _assert_true((unsigned_long)prVar2,"r1",
               "/workspace/llm4binary/github/license_c_cmakelists/RoaringBitmap[P]CRoaring/tests/toplevel_unit.c"
               ,0xd0b);
  uVar3 = roaring_bitmap_get_cardinality(prVar2);
  _assert_int_equal(0x4ffff,uVar3,
                    "/workspace/llm4binary/github/license_c_cmakelists/RoaringBitmap[P]CRoaring/tests/toplevel_unit.c"
                    ,0xd0d);
  roaring_bitmap_free(prVar2);
  roaring_bitmap_free(r);
  return;
}

Assistant:

void test_inplace_negation_helper(bool runopt, uint32_t gap) {
    roaring_bitmap_t *r1 = roaring_bitmap_create();
    assert_non_null(r1);

    for (uint32_t i = 0; i < 65536; ++i) {
        if (i % 147 < gap) continue;
        roaring_bitmap_add(r1, i);
        roaring_bitmap_add(r1, 5 * 65536 + i);
    }
    if (runopt) {
        bool hasrun = roaring_bitmap_run_optimize(r1);
        assert_true(hasrun);
    }

    int orig_card = (int)roaring_bitmap_get_cardinality(r1);
    roaring_bitmap_t *r1_orig = roaring_bitmap_copy(r1);

    // get the first batch of ones but not the second
    roaring_bitmap_flip_inplace(r1, 0U, 100000U);
    assert_non_null(r1);

    // lose some for key 0, but gain same num for key 5
    assert_int_equal(100000, roaring_bitmap_get_cardinality(r1));
    roaring_bitmap_free(r1);

    // flip all ones and beyond
    r1 = roaring_bitmap_copy(r1_orig);
    roaring_bitmap_flip_inplace(r1, 0U, 1000000U);
    assert_non_null(r1);
    assert_int_equal(1000000 - orig_card, roaring_bitmap_get_cardinality(r1));
    roaring_bitmap_free(r1);

    // Flip some bits in the middle
    r1 = roaring_bitmap_copy(r1_orig);
    roaring_bitmap_flip_inplace(r1, 100000U, 200000U);
    assert_non_null(r1);
    assert_int_equal(100000 + orig_card, roaring_bitmap_get_cardinality(r1));
    roaring_bitmap_free(r1);

    // flip almost all of the bits, end at an even boundary
    r1 = roaring_bitmap_copy(r1_orig);
    roaring_bitmap_flip_inplace(r1, 1U, 65536 * 6);
    assert_non_null(r1);
    assert_int_equal((65536 * 6 - 1) - orig_card,
                     roaring_bitmap_get_cardinality(r1));
    roaring_bitmap_free(r1);

    // flip first bunch of the bits, end at an even boundary
    r1 = roaring_bitmap_copy(r1_orig);
    roaring_bitmap_flip_inplace(r1, 1U, 65536 * 5);
    assert_non_null(r1);
    assert_int_equal(65536 * 5 - 1 - (orig_card / 2) + (orig_card / 2),
                     roaring_bitmap_get_cardinality(r1));
    roaring_bitmap_free(r1);

    roaring_bitmap_free(r1_orig);
}